

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::TaskSet::Task> * __thiscall
kj::Own<kj::TaskSet::Task>::operator=(Own<kj::TaskSet::Task> *this,Own<kj::TaskSet::Task> *other)

{
  Task *object;
  Task *this_00;
  Task *pTVar1;
  Disposer *in_RDX;
  
  object = (Task *)this->disposer;
  this_00 = this->ptr;
  pTVar1 = other->ptr;
  this->disposer = other->disposer;
  this->ptr = pTVar1;
  other->ptr = (Task *)0x0;
  if (this_00 != (Task *)0x0) {
    Disposer::Dispose_<kj::TaskSet::Task,_true>::dispose
              ((Dispose_<kj::TaskSet::Task,_true> *)this_00,object,in_RDX);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }